

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_add_hs_msg_to_checksum
              (mbedtls_ssl_context *ssl,uint hs_type,uchar *msg,size_t msg_len)

{
  int ret;
  size_t msg_len_local;
  uchar *msg_local;
  uint hs_type_local;
  mbedtls_ssl_context *ssl_local;
  
  ssl_local._4_4_ = mbedtls_ssl_add_hs_hdr_to_checksum(ssl,hs_type,msg_len);
  if (ssl_local._4_4_ == 0) {
    ssl_local._4_4_ = (*ssl->handshake->update_checksum)(ssl,msg,msg_len);
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_add_hs_msg_to_checksum(mbedtls_ssl_context *ssl,
                                       unsigned hs_type,
                                       unsigned char const *msg,
                                       size_t msg_len)
{
    int ret;
    ret = mbedtls_ssl_add_hs_hdr_to_checksum(ssl, hs_type, msg_len);
    if (ret != 0) {
        return ret;
    }
    return ssl->handshake->update_checksum(ssl, msg, msg_len);
}